

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int __thiscall CDemoPlayer::ReadChunkHeader(CDemoPlayer *this,int *pType,int *pSize,int *pTick)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  uchar Chunk;
  uchar aSizeData [1];
  byte local_35;
  ushort local_34 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_35 = 0;
  *pSize = 0;
  *pType = 0;
  uVar1 = io_read(this->m_File,&local_35,1);
  iVar2 = -1;
  if (uVar1 != 1) goto LAB_001339fb;
  uVar1 = (uint)local_35;
  if ((char)local_35 < '\0') {
    *pType = uVar1 & 0xffffffc0;
    if ((local_35 & 0x3f) == 0) {
      uVar1 = io_read(this->m_File,local_34,4);
      if (uVar1 != 4) goto LAB_001339fb;
      iVar2 = bytes_be_to_int((uchar *)local_34);
      *pTick = iVar2;
    }
    else {
      *pTick = *pTick + (uVar1 & 0x3f);
    }
  }
  else {
    *pType = (uint)(local_35 >> 5);
    *pSize = uVar1 & 0x1f;
    if ((~local_35 & 0x1f) == 0) {
      uVar1 = io_read(this->m_File,local_34,2);
      if (uVar1 != 2) goto LAB_001339fb;
      uVar1 = (uint)local_34[0];
    }
    else {
      if ((uVar1 & 0x1f) != 0x1e) goto LAB_001339f9;
      uVar1 = io_read(this->m_File,local_34,1);
      if (uVar1 != 1) goto LAB_001339fb;
      uVar1 = (uint)(byte)local_34[0];
    }
    *pSize = uVar1;
  }
LAB_001339f9:
  iVar2 = 0;
LAB_001339fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CDemoPlayer::ReadChunkHeader(int *pType, int *pSize, int *pTick)
{
	unsigned char Chunk = 0;

	*pSize = 0;
	*pType = 0;

	if(io_read(m_File, &Chunk, sizeof(Chunk)) != sizeof(Chunk))
		return -1;

	if(Chunk&CHUNKTYPEFLAG_TICKMARKER)
	{
		// decode tick marker
		int Tickdelta = Chunk&(CHUNKMASK_TICK);
		*pType = Chunk&(CHUNKTYPEFLAG_TICKMARKER|CHUNKTICKFLAG_KEYFRAME);

		if(Tickdelta == 0)
		{
			unsigned char aTickData[4];
			if(io_read(m_File, aTickData, sizeof(aTickData)) != sizeof(aTickData))
				return -1;
			*pTick = bytes_be_to_int(aTickData);
		}
		else
		{
			*pTick += Tickdelta;
		}
	}
	else
	{
		// decode normal chunk
		*pType = (Chunk&CHUNKMASK_TYPE)>>5;
		*pSize = Chunk&CHUNKMASK_SIZE;

		if(*pSize == 30)
		{
			unsigned char aSizeData[1];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = aSizeData[0];
		}
		else if(*pSize == 31)
		{
			unsigned char aSizeData[2];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = (aSizeData[1]<<8) | aSizeData[0];
		}
	}

	return 0;
}